

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

double __thiscall libDAI::NDP::ConstructOptimalAssignments(NDP *this)

{
  long lVar1;
  double *pdVar2;
  ostream *this_00;
  void *this_01;
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_RDI;
  valConf solution;
  size_t rI;
  size_t i;
  double value;
  size_t lastVarI;
  size_t in_stack_000000c8;
  NDP *in_stack_000000d0;
  size_t in_stack_ffffffffffffff88;
  TFactor<double> *in_stack_ffffffffffffff90;
  value_type *__x;
  value_type local_48;
  long local_28;
  ulong local_20;
  double local_18;
  ulong local_10;
  
  lVar1 = (**(code **)(*(long *)in_RDI[0x11].
                                super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                ._M_impl._M_node._M_size + 0x28))();
  local_10 = lVar1 - 1;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pdVar2 = TFactor<double>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_18 = *pdVar2;
  if (in_RDI[0xb].
      super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"NDP::ConstructOptimalAssignments() - value=");
    this_01 = (void *)std::ostream::operator<<(this_00,local_18);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  for (local_20 = 0; local_20 <= local_10; local_20 = local_20 + 1) {
    local_28 = local_10 - local_20;
    SelectStateForVar(in_stack_000000d0,in_stack_000000c8);
  }
  __x = &local_48;
  std::make_pair<double&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
            (&__x->first,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90);
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::push_front(in_RDI,__x);
  std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~pair
            ((pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0xbb7b28);
  return local_18;
}

Assistant:

double NDP::ConstructOptimalAssignments()
    {

        size_t lastVarI =  _g->nrVars()-1;

        //the optimal value is directly given by the factor introduced for
        //the very last variable! - which has 1 local state (the empty one)
        double value = _m_newFacs.at(lastVarI)[0];
        
        if(Props.verbose >= 1)
            cout << "NDP::ConstructOptimalAssignments() - value="<<value<<endl;

        //traverse the variables in reverse order:
        for(size_t i=0; i <= lastVarI; i++)
        {
            //reverse order index:
            size_t rI = lastVarI - i;
            SelectStateForVar(rI);
        }

        valConf solution = make_pair(value, _m_bestConfiguration );
        _valConfs.push_front(solution);

        return(value);
    }